

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepTrim::ON_BrepTrim(ON_BrepTrim *this)

{
  ON_BrepTrim *this_local;
  
  ON_CurveProxy::ON_CurveProxy(&this->super_ON_CurveProxy);
  (this->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_00b6b7b0;
  this->m_status = ON_ComponentStatus::NoneSet;
  this->m_reserved1 = 0;
  this->m_trim_index = -1;
  this->m_c2i = -1;
  this->m_ei = -1;
  this->m_bRev3d = false;
  this->m_type = unknown;
  this->m_iso = not_iso;
  this->m_li = -1;
  ON_SimpleArray<ON_BrepTrimPoint>::ON_SimpleArray(&this->m_pline);
  ON_BoundingBox::ON_BoundingBox(&this->m_pbox);
  this->m__legacy_2d_tol = -1.23432101234321e+308;
  this->m__legacy_3d_tol = -1.23432101234321e+308;
  this->m__legacy_flags = 0;
  this->m_brep = (ON_Brep *)0x0;
  (this->m_trim_user).h = 0;
  this->m_vi[1] = -1;
  this->m_vi[0] = -1;
  this->m_tolerance[1] = -1.23432101234321e+308;
  this->m_tolerance[0] = -1.23432101234321e+308;
  ON_SimpleArray<ON_BrepTrimPoint>::Reserve(&this->m_pline,4);
  return;
}

Assistant:

ON_BrepTrim::ON_BrepTrim()
{
  memset(&m_trim_user,0,sizeof(m_trim_user));
  m_vi[0] = m_vi[1] = -1; 
  m_tolerance[0] = m_tolerance[1] = ON_UNSET_VALUE;
  m_pline.Reserve(4); // This is a stopgap fix to insures the memory 
                      // pool used for pline segments is the same as
                      // the memory pool used for the rest of this brep.
  //m_P[0] = ON_3dPoint::UnsetPoint;
  //m_P[1] = ON_3dPoint::UnsetPoint;
}